

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QtPrivate::QCalendarView::QCalendarView(QCalendarView *this,QWidget *parent)

{
  QHeaderView *pQVar1;
  
  QTableView::QTableView(&this->super_QTableView,parent);
  *(undefined ***)
   &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame.
    super_QWidget = &PTR_metaObject_007c8568;
  *(undefined ***)
   &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame.
    super_QWidget.super_QPaintDevice = &PTR__QCalendarView_007c8878;
  this->readOnly = false;
  this->validDateClicked = false;
  QAbstractItemView::setTabKeyNavigation((QAbstractItemView *)this,false);
  QTableView::setShowGrid(&this->super_QTableView,false);
  pQVar1 = QTableView::verticalHeader(&this->super_QTableView);
  (**(code **)(*(long *)&(pQVar1->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x68))(pQVar1,0);
  pQVar1 = QTableView::horizontalHeader(&this->super_QTableView);
  (**(code **)(*(long *)&(pQVar1->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x68))(pQVar1,0);
  QAbstractScrollArea::setHorizontalScrollBarPolicy((QAbstractScrollArea *)this,ScrollBarAlwaysOff);
  QAbstractScrollArea::setVerticalScrollBarPolicy((QAbstractScrollArea *)this,ScrollBarAlwaysOff);
  return;
}

Assistant:

QCalendarView::QCalendarView(QWidget *parent)
    : QTableView(parent),
    readOnly(false),
    validDateClicked(false)
{
    setTabKeyNavigation(false);
    setShowGrid(false);
    verticalHeader()->setVisible(false);
    horizontalHeader()->setVisible(false);
    setHorizontalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
}